

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

bool __thiscall QCommandLineParserPrivate::parse(QCommandLineParserPrivate *this,QStringList *args)

{
  QStringList *this_00;
  QHash<long_long,_QList<QString>_> *this_01;
  byte bVar1;
  QArrayData *data;
  const_iterator cVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *data_00;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  Flags FVar10;
  QString **ppQVar11;
  long lVar12;
  Data<QHashPrivate::Node<QString,_long_long>_> *pDVar13;
  ulong uVar14;
  qsizetype position;
  uint uVar15;
  uchar *puVar16;
  byte bVar17;
  int iVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QLatin1StringView s;
  const_iterator cVar20;
  mapped_type optionOffset;
  QString local_b0;
  QString local_98;
  QString local_78;
  const_iterator local_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->needsParsing = false;
  if ((this->errorText).d.ptr != (char16_t *)0x0) {
    data = &((this->errorText).d.d)->super_QArrayData;
    (this->errorText).d.d = (Data *)0x0;
    (this->errorText).d.ptr = (char16_t *)0x0;
    (this->errorText).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  this_00 = &this->positionalArgumentList;
  QList<QString>::clear(this_00);
  QList<QString>::clear(&this->optionNames);
  QList<QString>::clear(&this->unknownOptionNames);
  this_01 = &this->optionValuesHash;
  QHash<long_long,_QList<QString>_>::clear(this_01);
  if ((args->d).size == 0) {
    parse();
    bVar9 = false;
  }
  else {
    local_60.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    ppQVar11 = &(args->d).ptr;
    bVar9 = false;
    bVar17 = 0;
    do {
      cVar2.i = *ppQVar11;
      local_60.i = cVar2.i + 1;
      if (local_60.i == (args->d).ptr + (args->d).size) break;
      local_78.d.d = cVar2.i[1].d.d;
      local_78.d.ptr = cVar2.i[1].d.ptr;
      local_78.d.size = cVar2.i[1].d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (bVar9) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->positionalArgumentList).d.size,
                   &local_78);
        QList<QString>::end(this_00);
LAB_003e0579:
        bVar19 = local_60.i == (args->d).ptr + (args->d).size;
      }
      else {
        s.m_data = "--";
        s.m_size = 2;
        bVar19 = QString::startsWith(&local_78,s,CaseSensitive);
        if (bVar19) {
          if ((ulong)local_78.d.size < 3) {
            bVar9 = true;
            goto LAB_003e0579;
          }
          local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QString::mid(&local_b0,&local_78,2,-1);
          QString::QString((QString *)local_58,(QChar)0x3d);
          QString::section(&local_98,&local_b0,(QString *)local_58,0,0,(SectionFlags)0x0);
          if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
              (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
            }
          }
          if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar19 = registerFoundOption(this,&local_98);
          bVar1 = 1;
          if (bVar19) {
            bVar19 = parseOptionValue(this,&local_98,&local_78,&local_60,
                                      (args->d).ptr + (args->d).size);
LAB_003e04a3:
            bVar1 = bVar17;
            if (bVar19 == false) {
              bVar1 = 1;
            }
          }
LAB_003e04b4:
          bVar17 = bVar1;
          if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_98.d.d !=
              (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_003e0579;
        }
        bVar19 = QString::startsWith(&local_78,(QChar)0x2d,CaseSensitive);
        if (!bVar19) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->positionalArgumentList).d.size,
                     &local_78);
          QList<QString>::end(this_00);
          if (this->optionsAfterPositionalArgumentsMode == ParseAsPositionalArguments) {
            bVar9 = true;
          }
          goto LAB_003e0579;
        }
        if (local_78.d.size != 1) {
          if (this->singleDashWordOptionMode != ParseAsLongOptions) {
            if (this->singleDashWordOptionMode == ParseAsCompactedShortOptions) {
              local_98.d.d = (Data *)0x0;
              local_98.d.ptr = (char16_t *)0x0;
              local_98.d.size = 0;
              if ((ulong)local_78.d.size < 2) {
                bVar19 = false;
              }
              else {
                iVar18 = 1;
                position = 1;
                bVar19 = false;
                do {
                  QString::mid((QString *)local_58,&local_78,position,1);
                  uVar7 = local_58._16_8_;
                  uVar6 = local_58._0_8_;
                  pcVar5 = local_98.d.ptr;
                  data_00 = local_98.d.d;
                  local_58._0_8_ = local_98.d.d;
                  local_98.d.d = (Data *)uVar6;
                  local_98.d.ptr = (char16_t *)local_58._8_8_;
                  local_58._8_8_ = pcVar5;
                  local_58._16_8_ = local_98.d.size;
                  local_98.d.size = uVar7;
                  if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)data_00 !=
                      (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                    LOCK();
                    (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                         -1;
                    UNLOCK();
                    if ((data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
                       ) {
                      QArrayData::deallocate(&data_00->super_QArrayData,2,0x10);
                    }
                  }
                  bVar8 = registerFoundOption(this,&local_98);
                  if (bVar8) {
                    cVar20 = QHash<QString,_long_long>::constFindImpl<QString>
                                       (&this->nameHash,&local_98);
                    pSVar3 = (cVar20.i.d)->spans;
                    uVar14 = cVar20.i.bucket >> 7;
                    local_b0.d.d = *(Data **)(pSVar3[uVar14].entries
                                              [pSVar3[uVar14].offsets[(uint)cVar20.i.bucket & 0x7f]]
                                              .storage.data + 0x18);
                    QCommandLineOption::valueName
                              ((QString *)local_58,
                               (this->commandLineOptionList).d.ptr + (long)local_b0.d.d);
                    uVar6 = local_58._16_8_;
                    if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
                        (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
                      }
                    }
                    lVar12 = (long)(iVar18 + 1);
                    if ((undefined1 *)uVar6 == (undefined1 *)0x0) {
                      if ((lVar12 < local_78.d.size) && (local_78.d.ptr[lVar12] == L'='))
                      goto LAB_003e085f;
                      bVar8 = true;
                    }
                    else {
                      if (lVar12 < local_78.d.size) {
                        if (local_78.d.ptr[lVar12] == L'=') {
                          iVar18 = iVar18 + 1;
                        }
                        QHash<long_long,QList<QString>>::tryEmplace_impl<long_long_const&>
                                  ((TryEmplaceResult *)local_58,this_01,(longlong *)&local_b0);
                        pEVar4 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].
                                 entries;
                        bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].
                                offsets[(uint)local_58._8_8_ & 0x7f];
                        QString::mid((QString *)local_58,&local_78,(long)(iVar18 + 1),-1);
                        puVar16 = pEVar4[bVar1].storage.data + 8;
                        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                  ((QMovableArrayOps<QString> *)puVar16,
                                   *(qsizetype *)(pEVar4[bVar1].storage.data + 0x18),
                                   (QString *)local_58);
                        QList<QString>::end((QList<QString> *)puVar16);
                        if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_
                            != (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
                          }
                        }
                        bVar19 = true;
                      }
LAB_003e085f:
                      bVar8 = false;
                    }
                    if (!bVar8) break;
                  }
                  else {
                    bVar17 = 1;
                  }
                  iVar18 = iVar18 + 1;
                  position = (qsizetype)iVar18;
                } while (position < local_78.d.size);
              }
              bVar1 = bVar17;
              if (!bVar19) {
                bVar19 = parseOptionValue(this,&local_98,&local_78,&local_60,
                                          (args->d).ptr + (args->d).size);
                goto LAB_003e04a3;
              }
              goto LAB_003e04b4;
            }
            goto LAB_003e0579;
          }
          if (2 < (ulong)local_78.d.size) {
            local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid(&local_98,&local_78,1,1);
            cVar20 = QHash<QString,_long_long>::constFindImpl<QString>(&this->nameHash,&local_98);
            pDVar13 = cVar20.i.d;
            if (pDVar13 == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 &&
                cVar20.i.bucket == 0) {
LAB_003e0a3d:
              iVar18 = 0;
            }
            else {
              uVar14 = cVar20.i.bucket >> 7;
              uVar15 = (uint)cVar20.i.bucket & 0x7f;
              FVar10 = QCommandLineOption::flags
                                 ((this->commandLineOptionList).d.ptr +
                                  *(long *)(pDVar13->spans[uVar14].entries
                                            [pDVar13->spans[uVar14].offsets[uVar15]].storage.data +
                                           0x18));
              iVar18 = 0;
              if (((uint)FVar10.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                         super_QFlagsStorage<QCommandLineOption::Flag>.i & 2) != 0) {
                registerFoundOption(this,&local_98);
                QHash<long_long,QList<QString>>::tryEmplace_impl<long_long_const&>
                          ((TryEmplaceResult *)local_58,this_01,
                           (longlong *)
                           (pDVar13->spans[uVar14].entries[pDVar13->spans[uVar14].offsets[uVar15]].
                            storage.data + 0x18));
                pEVar4 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
                bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                        [(uint)local_58._8_8_ & 0x7f];
                QString::mid((QString *)local_58,&local_78,2,-1);
                puVar16 = pEVar4[bVar1].storage.data + 8;
                QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                          ((QMovableArrayOps<QString> *)puVar16,
                           *(qsizetype *)(pEVar4[bVar1].storage.data + 0x18),(QString *)local_58);
                QList<QString>::end((QList<QString> *)puVar16);
                if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
                    (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
                  }
                }
                iVar18 = 5;
              }
              if (((uint)FVar10.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                         super_QFlagsStorage<QCommandLineOption::Flag>.i & 2) == 0)
              goto LAB_003e0a3d;
            }
            if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_98.d.d !=
                (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
              LOCK();
              ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (iVar18 != 0) goto LAB_003e0579;
          }
          local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QString::mid(&local_b0,&local_78,1,-1);
          QString::QString((QString *)local_58,(QChar)0x3d);
          QString::section(&local_98,&local_b0,(QString *)local_58,0,0,(SectionFlags)0x0);
          if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
              (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
            }
          }
          if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar19 = registerFoundOption(this,&local_98);
          bVar1 = 1;
          if (bVar19) {
            bVar19 = parseOptionValue(this,&local_98,&local_78,&local_60,
                                      (args->d).ptr + (args->d).size);
            goto LAB_003e04a3;
          }
          goto LAB_003e04b4;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->positionalArgumentList).d.size,
                   &local_78);
        QList<QString>::end(this_00);
        bVar19 = false;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      ppQVar11 = &local_60.i;
    } while (!bVar19);
    bVar9 = (bool)(bVar17 ^ 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QCommandLineParserPrivate::parse(const QStringList &args)
{
    needsParsing = false;
    bool error = false;

    const QLatin1Char dashChar('-');
    const QLatin1Char assignChar('=');

    bool forcePositional = false;
    errorText.clear();
    positionalArgumentList.clear();
    optionNames.clear();
    unknownOptionNames.clear();
    optionValuesHash.clear();

    if (args.isEmpty()) {
        qWarning("QCommandLineParser: argument list cannot be empty, it should contain at least the executable name");
        return false;
    }

    QStringList::const_iterator argumentIterator = args.begin();
    ++argumentIterator; // skip executable name

    for (; argumentIterator != args.end() ; ++argumentIterator) {
        QString argument = *argumentIterator;

        if (forcePositional) {
            positionalArgumentList.append(argument);
        } else if (argument.startsWith("--"_L1)) {
            if (argument.size() > 2) {
                QString optionName = argument.mid(2).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
            } else {
                forcePositional = true;
            }
        } else if (argument.startsWith(dashChar)) {
            if (argument.size() == 1) { // single dash ("stdin")
                positionalArgumentList.append(argument);
                continue;
            }
            switch (singleDashWordOptionMode) {
            case QCommandLineParser::ParseAsCompactedShortOptions:
            {
                QString optionName;
                bool valueFound = false;
                for (int pos = 1 ; pos < argument.size(); ++pos) {
                    optionName = argument.mid(pos, 1);
                    if (!registerFoundOption(optionName)) {
                        error = true;
                    } else {
                        const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
                        Q_ASSERT(nameHashIt != nameHash.constEnd()); // checked by registerFoundOption
                        const NameHash_t::mapped_type optionOffset = *nameHashIt;
                        const bool withValue = !commandLineOptionList.at(optionOffset).valueName().isEmpty();
                        if (withValue) {
                            if (pos + 1 < argument.size()) {
                                if (argument.at(pos + 1) == assignChar)
                                    ++pos;
                                optionValuesHash[optionOffset].append(argument.mid(pos + 1));
                                valueFound = true;
                            }
                            break;
                        }
                        if (pos + 1 < argument.size() && argument.at(pos + 1) == assignChar)
                            break;
                    }
                }
                if (!valueFound && !parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                    error = true;
                break;
            }
            case QCommandLineParser::ParseAsLongOptions:
            {
                if (argument.size() > 2) {
                    const QString possibleShortOptionStyleName = argument.mid(1, 1);
                    const auto shortOptionIt = nameHash.constFind(possibleShortOptionStyleName);
                    if (shortOptionIt != nameHash.constEnd()) {
                        const auto &arg = commandLineOptionList.at(*shortOptionIt);
                        if (arg.flags() & QCommandLineOption::ShortOptionStyle) {
                            registerFoundOption(possibleShortOptionStyleName);
                            optionValuesHash[*shortOptionIt].append(argument.mid(2));
                            break;
                        }
                    }
                }
                const QString optionName = argument.mid(1).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
                break;
            }
            }
        } else {
            positionalArgumentList.append(argument);
            if (optionsAfterPositionalArgumentsMode == QCommandLineParser::ParseAsPositionalArguments)
                forcePositional = true;
        }
        if (argumentIterator == args.end())
            break;
    }
    return !error;
}